

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

TemporalBinInfo *
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::UserGeometry>,_2UL>
::TemporalBinInfo::merge2
          (TemporalBinInfo *__return_storage_ptr__,TemporalBinInfo *a,TemporalBinInfo *b)

{
  undefined1 auVar1 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  
  TemporalBinInfo(__return_storage_ptr__,a);
  auVar3._0_8_ = __return_storage_ptr__->count0[0];
  auVar3._8_8_ = __return_storage_ptr__->count1[0];
  auVar1._0_8_ = b->count0[0];
  auVar1._8_8_ = b->count1[0];
  auVar3 = vpaddq_avx(auVar3,auVar1);
  __return_storage_ptr__->count0[0] = auVar3._0_8_;
  __return_storage_ptr__->count1[0] = auVar3._8_8_;
  aVar2.m128 = (__m128)vminps_avx(__return_storage_ptr__->bounds0[0].bounds0.lower.field_0,
                                  b->bounds0[0].bounds0.lower.field_0);
  __return_storage_ptr__->bounds0[0].bounds0.lower.field_0 = aVar2;
  aVar2.m128 = (__m128)vmaxps_avx(__return_storage_ptr__->bounds0[0].bounds0.upper.field_0,
                                  b->bounds0[0].bounds0.upper.field_0);
  __return_storage_ptr__->bounds0[0].bounds0.upper.field_0 = aVar2;
  aVar2.m128 = (__m128)vminps_avx(__return_storage_ptr__->bounds0[0].bounds1.lower.field_0,
                                  b->bounds0[0].bounds1.lower.field_0);
  __return_storage_ptr__->bounds0[0].bounds1.lower.field_0 = aVar2;
  aVar2.m128 = (__m128)vmaxps_avx(__return_storage_ptr__->bounds0[0].bounds1.upper.field_0,
                                  b->bounds0[0].bounds1.upper.field_0);
  __return_storage_ptr__->bounds0[0].bounds1.upper.field_0 = aVar2;
  aVar2.m128 = (__m128)vminps_avx(__return_storage_ptr__->bounds1[0].bounds0.lower.field_0,
                                  b->bounds1[0].bounds0.lower.field_0);
  __return_storage_ptr__->bounds1[0].bounds0.lower.field_0 = aVar2;
  aVar2.m128 = (__m128)vmaxps_avx(__return_storage_ptr__->bounds1[0].bounds0.upper.field_0,
                                  b->bounds1[0].bounds0.upper.field_0);
  __return_storage_ptr__->bounds1[0].bounds0.upper.field_0 = aVar2;
  aVar2.m128 = (__m128)vminps_avx(__return_storage_ptr__->bounds1[0].bounds1.lower.field_0,
                                  b->bounds1[0].bounds1.lower.field_0);
  __return_storage_ptr__->bounds1[0].bounds1.lower.field_0 = aVar2;
  aVar2.m128 = (__m128)vmaxps_avx(__return_storage_ptr__->bounds1[0].bounds1.upper.field_0,
                                  b->bounds1[0].bounds1.upper.field_0);
  __return_storage_ptr__->bounds1[0].bounds1.upper.field_0 = aVar2;
  return __return_storage_ptr__;
}

Assistant:

static __forceinline const TemporalBinInfo merge2(const TemporalBinInfo& a, const TemporalBinInfo& b) {
            TemporalBinInfo r = a; r.merge(b); return r;
          }